

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  uint *in_RDX;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_RSI;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_RDI;
  SignParameter *sign_param_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range1_1;
  Pubkey related_pubkey;
  SignParameter sign_param;
  iterator itr;
  string pubkey_hex;
  Pubkey *pubkey;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signature_list;
  SignParameter *in_stack_fffffffffffffd28;
  SignParameter *in_stack_fffffffffffffd30;
  value_type *in_stack_fffffffffffffd38;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffd40;
  byte in_stack_fffffffffffffd47;
  iterator in_stack_fffffffffffffd48;
  CfdError CVar5;
  undefined5 in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd55;
  undefined1 in_stack_fffffffffffffd56;
  byte in_stack_fffffffffffffd57;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  allocator in_stack_fffffffffffffd7f;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_fffffffffffffd80;
  string local_260 [56];
  string local_228 [16];
  SignParameter *in_stack_fffffffffffffde8;
  SignParameter *in_stack_fffffffffffffdf0;
  __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_1c8;
  undefined1 *local_1c0;
  SignParameter *local_1b0;
  undefined4 local_1a8;
  byte local_1a1;
  string local_1a0 [176];
  SignParameter *local_f0;
  __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_e8;
  string local_e0 [32];
  reference local_c0;
  Pubkey *local_b8;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [31];
  byte local_81;
  undefined1 local_80 [48];
  string local_50 [32];
  char *local_30;
  undefined4 local_28;
  char *local_20;
  uint *local_18;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::empty
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  if ((!bVar1) &&
     (sVar2 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::size(local_10),
     sVar2 < 0x10)) {
    cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)local_80,local_18);
    local_81 = 0;
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x3b1981);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
              (in_stack_fffffffffffffd80,
               (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
    local_a8 = local_80;
    local_b0._M_current =
         (Pubkey *)
         std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                   ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                    in_stack_fffffffffffffd28);
    local_b8 = (Pubkey *)
               std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                         ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                          in_stack_fffffffffffffd28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                               *)in_stack_fffffffffffffd28), bVar1) {
      local_c0 = __gnu_cxx::
                 __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                 ::operator*(&local_b0);
      cfd::core::Pubkey::GetHex_abi_cxx11_();
      local_e8._M_current =
           (SignParameter *)
           std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                     (in_stack_fffffffffffffd28);
      while( true ) {
        local_f0 = (SignParameter *)
                   std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                             ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                              in_stack_fffffffffffffd28);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                            *)in_stack_fffffffffffffd30,
                           (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                            *)in_stack_fffffffffffffd28);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
        ::operator*(&local_e8);
        SignParameter::SignParameter(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd28);
        local_1a1 = 0;
        in_stack_fffffffffffffd57 = cfd::core::Pubkey::IsValid();
        in_stack_fffffffffffffd55 = true;
        if ((in_stack_fffffffffffffd57 & 1) != 0) {
          cfd::core::Pubkey::GetHex_abi_cxx11_();
          local_1a1 = 1;
          in_stack_fffffffffffffd55 =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd30,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd28);
        }
        in_stack_fffffffffffffd56 = in_stack_fffffffffffffd55;
        if ((local_1a1 & 1) != 0) {
          std::__cxx11::string::~string(local_1a0);
        }
        if ((in_stack_fffffffffffffd55 & 1) == 0) {
          __gnu_cxx::
          __normal_iterator<cfd::SignParameter_const*,std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>>
          ::__normal_iterator<cfd::SignParameter*>
                    ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                      *)in_stack_fffffffffffffd30,
                     (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                      *)in_stack_fffffffffffffd28);
          in_stack_fffffffffffffd48 =
               std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::erase
                         ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                          CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd48._M_current);
          local_1b0 = in_stack_fffffffffffffd48._M_current;
          local_e8._M_current = in_stack_fffffffffffffd48._M_current;
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38);
          local_1a8 = 0;
        }
        else {
          __gnu_cxx::
          __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
          ::operator++(&local_e8);
          local_1a8 = 5;
        }
        core::Pubkey::~Pubkey((Pubkey *)0x3b1c4d);
        SignParameter::~SignParameter(in_stack_fffffffffffffd30);
      }
      std::__cxx11::string::~string(local_e0);
      __gnu_cxx::
      __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
      ::operator++(&local_b0);
    }
    local_1c0 = local_a0;
    local_1c8._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   (in_stack_fffffffffffffd28);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffd28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar1) {
        local_81 = 1;
        local_1a8 = 1;
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        if ((local_81 & 1) == 0) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        }
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator*(&local_1c8);
      SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd47 = cfd::core::Pubkey::IsValid();
      core::Pubkey::~Pubkey((Pubkey *)0x3b1d55);
      CVar5 = (CfdError)((ulong)in_stack_fffffffffffffd48._M_current >> 0x20);
      if ((in_stack_fffffffffffffd47 & 1) != 0) break;
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
      __gnu_cxx::
      __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_1c8);
    }
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction.cpp"
            ,0x2f);
    SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd28);
    cfd::core::Pubkey::GetHex_abi_cxx11_();
    cfd::core::Script::GetHex_abi_cxx11_();
    core::logger::warn<std::__cxx11::string,std::__cxx11::string_const>
              ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (char *)in_stack_fffffffffffffd38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_228);
    core::Pubkey::~Pubkey((Pubkey *)0x3b1e21);
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = (allocator *)&stack0xfffffffffffffd7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd80,
               "Missing related pubkey in script. Check your signature and pubkey pair.",paVar4);
    core::CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
               CVar5,(string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  CVar5 = (CfdError)((ulong)in_stack_fffffffffffffd48._M_current >> 0x20);
  local_30 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction.cpp"
                     ,0x2f);
  local_30 = local_30 + 1;
  local_28 = 0x2dc;
  local_20 = "CheckMultisig";
  core::logger::warn<unsigned_int_const&>
            ((CfdSourceLocation *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (uint *)0x3b1875);
  local_80[0x1b] = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"Value out of range. sign array length fail.",(allocator *)(local_80 + 0x2f));
  core::CfdException::CfdException
            ((CfdException *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,
                               CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),CVar5
             ,(string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  local_80[0x1b] = 0;
  __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}